

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

AssertionResult * __thiscall Catch::ResultBuilder::build(ResultBuilder *this)

{
  AssertionResult *in_RSI;
  AssertionResult *in_RDI;
  AssertionResultData data;
  char *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  string *this_00;
  AssertionResult *info;
  string local_108 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  string local_c8 [32];
  string local_a8 [48];
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  int local_18;
  
  info = in_RDI;
  AssertionResultData::AssertionResultData
            ((AssertionResultData *)in_RSI,(AssertionResultData *)in_RDI);
  if (((byte)in_RSI[1].m_info.macroName & 1) != 0) {
    if (local_18 == 0) {
      local_18 = 0x11;
    }
    else if (local_18 == 0x11) {
      local_18 = 0;
    }
  }
  std::__cxx11::ostringstream::str();
  this_00 = local_78;
  std::__cxx11::string::operator=(local_38,this_00);
  std::__cxx11::string::~string(this_00);
  reconstructExpression_abi_cxx11_((ResultBuilder *)data._24_8_);
  std::__cxx11::string::operator=(local_58,local_a8);
  std::__cxx11::string::~string(local_a8);
  if (((byte)in_RSI[1].m_info.macroName & 1) != 0) {
    in_stack_fffffffffffffed7 =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                         in_stack_fffffffffffffec8);
    if ((bool)in_stack_fffffffffffffed7) {
      std::operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
      std::__cxx11::string::operator=(local_58,local_c8);
      std::__cxx11::string::~string(local_c8);
    }
    else {
      std::operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                     (char *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
      std::__cxx11::string::operator=(local_58,(string *)&stack0xffffffffffffff18);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff18);
      std::__cxx11::string::~string(local_108);
    }
  }
  AssertionResult::AssertionResult(in_RSI,&info->m_info,(AssertionResultData *)in_RDI);
  AssertionResultData::~AssertionResultData
            ((AssertionResultData *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
  return info;
}

Assistant:

AssertionResult ResultBuilder::build() const
    {
        assert( m_data.resultType != ResultWas::Unknown );

        AssertionResultData data = m_data;

        // Flip bool results if testFalse is set
        if( m_exprComponents.testFalse ) {
            if( data.resultType == ResultWas::Ok )
                data.resultType = ResultWas::ExpressionFailed;
            else if( data.resultType == ResultWas::ExpressionFailed )
                data.resultType = ResultWas::Ok;
        }

        data.message = m_stream.oss.str();
        data.reconstructedExpression = reconstructExpression();
        if( m_exprComponents.testFalse ) {
            if( m_exprComponents.op == "" )
                data.reconstructedExpression = "!" + data.reconstructedExpression;
            else
                data.reconstructedExpression = "!(" + data.reconstructedExpression + ")";
        }
        return AssertionResult( m_assertionInfo, data );
    }